

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
write_decimal<long_long>(basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this,longlong value)

{
  int iVar1;
  checked_ptr<typename_buffer<char>::value_type> pcVar2;
  uint64_t n;
  
  n = -value;
  if (0 < value) {
    n = value;
  }
  iVar1 = count_digits(n);
  pcVar2 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                     (&this->out_,(long)iVar1 - (value >> 0x3f));
  if (value < 0) {
    *pcVar2 = '-';
    pcVar2 = pcVar2 + 1;
  }
  format_decimal<char,unsigned_long,char*,duckdb_fmt::v6::internal::format_decimal<char,char*,unsigned_long>(char*,unsigned_long,int)::_lambda(char*)_1_>
            (pcVar2,n,iVar1);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }